

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimPatAssignInputs(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,Vec_Wrd_t *vSimsIn)

{
  uint __line;
  int iVar1;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  int v;
  char *__assertion;
  int i;
  
  if (vSims->nSize == p->nObjs * nWords) {
    iVar1 = p->vCis->nSize;
    if (vSimsIn->nSize == iVar1 * nWords) {
      i = 0;
      v = 0;
      while( true ) {
        if (iVar1 <= v) {
          return;
        }
        pObj = Gia_ManCi(p,v);
        iVar1 = Gia_ObjId(p,pObj);
        if (iVar1 == 0) break;
        __dest = Vec_WrdEntryP(vSims,iVar1 * nWords);
        __src = Vec_WrdEntryP(vSimsIn,i);
        memcpy(__dest,__src,(long)nWords << 3);
        v = v + 1;
        iVar1 = p->vCis->nSize;
        i = i + nWords;
      }
      return;
    }
    __assertion = "Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p)";
    __line = 0x57;
  }
  else {
    __assertion = "Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)";
    __line = 0x56;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,__line,"void Gia_ManSimPatAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
               );
}

Assistant:

void Gia_ManSimPatAssignInputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, Vec_Wrd_t * vSimsIn )
{
    int i, Id;
    assert( Vec_WrdSize(vSims)   == nWords * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        memcpy( Vec_WrdEntryP(vSims, Id*nWords), Vec_WrdEntryP(vSimsIn, i*nWords), sizeof(word)*nWords );
}